

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O2

void predict_or_learn<false>(boosting *o,single_learner *base,example *ec)

{
  float fVar1;
  int i;
  size_t i_00;
  float fVar2;
  
  fVar1 = ec->weight;
  fVar2 = 0.0;
  for (i_00 = 0; (long)i_00 < (long)o->N; i_00 = i_00 + 1) {
    LEARNER::learner<char,_example>::predict(base,ec,i_00);
    fVar2 = fVar2 + (ec->pred).scalar;
  }
  ec->weight = fVar1;
  ec->partial_prediction = fVar2;
  fVar2 = *(float *)(&DAT_0023dc88 + (ulong)(0.0 < fVar2) * 4);
  (ec->pred).scalar = fVar2;
  ec->loss = (float)(~-(uint)(fVar2 == (ec->l).simple.label) & (uint)fVar1);
  return;
}

Assistant:

void predict_or_learn(boosting& o, LEARNER::single_learner& base, example& ec)
{
  label_data& ld = ec.l.simple;

  float final_prediction = 0;

  float s = 0;
  float u = ec.weight;

  if (is_learn)
    o.t++;

  for (int i = 0; i < o.N; i++)
  {
    if (is_learn)
    {
      float k = floorf((float)(o.N - i - s) / 2);
      int64_t c;
      if (o.N - (i + 1) < 0)
        c = 0;
      else if (k > o.N - (i + 1))
        c = 0;
      else if (k < 0)
        c = 0;
      else if (o.C[o.N - (i + 1)][(int64_t)k] != -1)
        c = o.C[o.N - (i + 1)][(int64_t)k];
      else
      {
        c = choose(o.N - (i + 1), (int64_t)k);
        o.C[o.N - (i + 1)][(int64_t)k] = c;
      }

      float w = c * (float)pow((double)(0.5 + o.gamma), (double)k) *
          (float)pow((double)0.5 - o.gamma, (double)(o.N - (i + 1) - k));

      // update ec.weight, weight for learner i (starting from 0)
      ec.weight = u * w;

      base.predict(ec, i);

      // ec.pred.scalar is now the i-th learner prediction on this example
      s += ld.label * ec.pred.scalar;

      final_prediction += ec.pred.scalar;

      base.learn(ec, i);
    }
    else
    {
      base.predict(ec, i);
      final_prediction += ec.pred.scalar;
    }
  }

  ec.weight = u;
  ec.partial_prediction = final_prediction;
  ec.pred.scalar = sign(final_prediction);

  if (ld.label == ec.pred.scalar)
    ec.loss = 0.;
  else
    ec.loss = ec.weight;
}